

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TZDBTimeZoneNames::getMetaZoneDisplayName
          (TZDBTimeZoneNames *this,UnicodeString *mzID,UTimeZoneNameType type,UnicodeString *name)

{
  TZDBNames *this_00;
  UErrorCode status;
  ConstChar16Ptr local_30 [3];
  
  UnicodeString::setToBogus(name);
  if (0x1f < (ushort)(mzID->fUnion).fStackFields.fLengthAndFlags) {
    status = U_ZERO_ERROR;
    this_00 = getMetaZoneNames(mzID,&status);
    if ((this_00 != (TZDBNames *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
      local_30[0].p_ = TZDBNames::getName(this_00,type);
      if (local_30[0].p_ != (UChar *)0x0) {
        UnicodeString::setTo(name,'\x01',local_30,-1);
      }
    }
  }
  return name;
}

Assistant:

UnicodeString&
TZDBTimeZoneNames::getMetaZoneDisplayName(const UnicodeString& mzID,
                                          UTimeZoneNameType type,
                                          UnicodeString& name) const {
    name.setToBogus();
    if (mzID.isEmpty()) {
        return name;
    }

    UErrorCode status = U_ZERO_ERROR;
    const TZDBNames *tzdbNames = TZDBTimeZoneNames::getMetaZoneNames(mzID, status);
    if (U_SUCCESS(status)) {
        if (tzdbNames != NULL) {
            const UChar *s = tzdbNames->getName(type);
            if (s != NULL) {
                name.setTo(TRUE, s, -1);
            }
        }
    }

    return name;
}